

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KokkosLookup.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_455b80::KokkosLookup::KokkosLookup(KokkosLookup *this,Caliper *c,Channel *chn)

{
  Channel local_40;
  undefined1 local_30 [8];
  ConfigSet config;
  Channel *chn_local;
  Caliper *c_local;
  KokkosLookup *this_local;
  
  this->m_num_spaces = 0;
  this->m_num_copies = 0;
  config.mP.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)chn;
  cali::Attribute::Attribute(&this->m_space_attr);
  cali::Attribute::Attribute(&this->m_size_attr);
  cali::Attribute::Attribute(&this->m_dst_attr);
  cali::Attribute::Attribute(&this->m_src_attr);
  cali::Channel::Channel
            (&this->m_channel,
             (Channel *)
             config.mP.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  cali::Channel::config(&local_40);
  cali::RuntimeConfig::init((RuntimeConfig *)local_30,(EVP_PKEY_CTX *)&local_40);
  cali::RuntimeConfig::~RuntimeConfig((RuntimeConfig *)&local_40);
  make_attributes(this,c);
  cali::ConfigSet::~ConfigSet((ConfigSet *)local_30);
  return;
}

Assistant:

KokkosLookup(Caliper* c, Channel* chn) : m_channel(*chn)
    {
        ConfigSet config = chn->config().init("kokkoslookup", s_configdata);

        make_attributes(c);
    }